

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O1

int AddTimeout(stTimeout_t *apTimeout,stTimeoutItem_t *apItem,unsigned_long_long allNow)

{
  stTimeoutItem_t *psVar1;
  ulong uVar2;
  int iVar3;
  stTimeoutItemLink_t *psVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (apTimeout->ullStart == 0) {
    apTimeout->ullStart = allNow;
    apTimeout->llStartIdx = 0;
  }
  iVar3 = 0x188;
  if (apTimeout->ullStart <= allNow) {
    iVar3 = 399;
    if (allNow <= apItem->ullExpireTime) {
      uVar5 = apItem->ullExpireTime - apTimeout->ullStart;
      uVar6 = (ulong)apTimeout->iItemSize;
      uVar2 = uVar6 - 1;
      if (uVar5 < uVar6) {
        uVar2 = uVar5;
      }
      iVar3 = 0;
      if (apItem->pLink == (stTimeoutItemLink_t *)0x0) {
        psVar4 = apTimeout->pItems + (uVar2 + apTimeout->llStartIdx) % uVar6;
        psVar1 = psVar4->tail;
        if (psVar1 == (stTimeoutItem_t *)0x0) {
          psVar4->tail = apItem;
          psVar4->head = apItem;
          apItem->pPrev = (stTimeoutItem_t *)0x0;
          apItem->pNext = (stTimeoutItem_t *)0x0;
        }
        else {
          psVar1->pNext = apItem;
          apItem->pNext = (stTimeoutItem_t *)0x0;
          apItem->pPrev = psVar1;
          psVar4->tail = apItem;
        }
        apItem->pLink = psVar4;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int AddTimeout( stTimeout_t *apTimeout,stTimeoutItem_t *apItem ,unsigned long long allNow )
{
	if( apTimeout->ullStart == 0 )
	{
		apTimeout->ullStart = allNow;
		apTimeout->llStartIdx = 0;
	}
	if( allNow < apTimeout->ullStart )
	{
		co_log_err("CO_ERR: AddTimeout line %d allNow %llu apTimeout->ullStart %llu",
					__LINE__,allNow,apTimeout->ullStart);

		return __LINE__;
	}
	if( apItem->ullExpireTime < allNow )
	{
		co_log_err("CO_ERR: AddTimeout line %d apItem->ullExpireTime %llu allNow %llu apTimeout->ullStart %llu",
					__LINE__,apItem->ullExpireTime,allNow,apTimeout->ullStart);

		return __LINE__;
	}
	unsigned long long diff = apItem->ullExpireTime - apTimeout->ullStart;

	if( diff >= (unsigned long long)apTimeout->iItemSize )
	{
		diff = apTimeout->iItemSize - 1;
		co_log_err("CO_ERR: AddTimeout line %d diff %d",
					__LINE__,diff);

		//return __LINE__;
	}
	AddTail( apTimeout->pItems + ( apTimeout->llStartIdx + diff ) % apTimeout->iItemSize , apItem );

	return 0;
}